

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O2

void __thiscall Fl_GTK_File_Chooser::Fl_GTK_File_Chooser(Fl_GTK_File_Chooser *this,int val)

{
  (this->super_Fl_FLTK_File_Chooser)._options = 0;
  (this->super_Fl_FLTK_File_Chooser)._nfilters = 0;
  (this->super_Fl_FLTK_File_Chooser)._filter = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._parsedfilt = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._filtvalue = 0;
  (this->super_Fl_FLTK_File_Chooser)._preset_file = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._prevvalue = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._file_chooser = (Fl_File_Chooser *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._directory = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._errmsg = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._vptr_Fl_FLTK_File_Chooser =
       (_func_int **)&PTR__Fl_GTK_File_Chooser_002571e0;
  this->gtkw_ptr = (GtkWidget *)0x0;
  this->gtkw_slist = (void *)0x0;
  this->gtkw_count = 0;
  this->gtkw_filename = (char *)0x0;
  this->gtkw_title = (char *)0x0;
  (this->super_Fl_FLTK_File_Chooser)._btype = val;
  this->previous_filter = (char *)0x0;
  return;
}

Assistant:

Fl_FLTK_File_Chooser::Fl_FLTK_File_Chooser(int val) {
  _btype       = 0;
  _options     = 0;
  _filter      = NULL;
  _filtvalue   = 0;
  _parsedfilt  = NULL;
  _preset_file = NULL;
  _prevvalue   = NULL;
  _directory   = NULL;
  _errmsg      = NULL;
  _file_chooser= NULL;
  if (val >= 0) {
    _file_chooser = new Fl_File_Chooser(NULL, NULL, 0, NULL);
    type(val);			// do this after _file_chooser created
    }
  _nfilters    = 0;
}